

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::split_lines<false,2>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*s_) [2])

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *a_;
  size_t in_RCX;
  void *__buf;
  char *s__00;
  char *s__01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__02;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__03;
  basic_file_view<false> *c__04;
  allocator<char> local_eb1;
  allocator<char> local_eb0 [32];
  assert_equal_container local_e90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e68;
  string path;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view5;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view4;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view3;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view2;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  view1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  string str;
  directory tmp;
  basic_file_view<false> view6;
  ifstream fs1;
  istringstream s3;
  istringstream s2;
  istringstream s1;
  ifstream fs3;
  ifstream fs2;
  
  just::temp::directory::directory((directory *)&tmp._path);
  std::operator+(&path,&tmp._path,"/test");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs1,(char *)this,(allocator<char> *)&fs2);
  just::file::write((file *)&path,(int)&fs1,__buf,in_RCX);
  local_e68 = __return_storage_ptr__;
  std::__cxx11::string::~string((string *)&fs1);
  std::ifstream::ifstream(&fs1,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs2,path._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&fs3,path._M_dataplus._M_p,_S_in|_S_bin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,(char *)this,(allocator<char> *)&s2);
  std::__cxx11::istringstream::istringstream((istringstream *)&s1,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,(char *)this,(allocator<char> *)&s3);
  std::__cxx11::istringstream::istringstream((istringstream *)&s2,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&view6,(char *)this,(allocator<char> *)&local_e90);
  std::__cxx11::istringstream::istringstream((istringstream *)&s3,(string *)&view6,_S_in);
  std::__cxx11::string::~string((string *)&view6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,(char *)this,(allocator<char> *)&view6);
  view5._stream = (istream *)&fs2;
  view4._stream = (istream *)&s2;
  view3._stream = (istream *)&fs1;
  view2._stream = (istream *)&s1;
  view1._string = &str;
  just::lines::basic_file_view<false>::basic_file_view(&view6,&path);
  a_ = local_e68;
  just::lines::split<false,char_const>(local_e68,(lines *)this,s__00);
  just::lines::split<false,char_const>(&v2,(lines *)this,s__01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e90,(char *)this,local_eb0);
  just::lines::split<false,std::__cxx11::string>(&v3,(lines *)&local_e90,s__02);
  std::__cxx11::string::~string((string *)&local_e90);
  just::lines::split<false>(&v4,(istream *)&s3);
  just::lines::split<false>(&v5,(istream *)&fs3);
  just::lines::split_lines_of_file<false>(&v6,&path);
  create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&v7,(_anonymous_namespace_ *)&view1,c_);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&v8,(_anonymous_namespace_ *)&view2,c__00);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&v9,(_anonymous_namespace_ *)&view3,c__01);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&v10,(_anonymous_namespace_ *)&view4,c__02);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&v11,(_anonymous_namespace_ *)&view5,c__03);
  create_vector<just::lines::basic_file_view<false>>(&v12,(_anonymous_namespace_ *)&view6,c__04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,a_,&v2);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v2,&v3);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v3,&v4);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v4,&v5);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v5,&v6);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v6,&v7);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v7,&v8);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v8,&v9);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v9,&v10);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,&local_eb1);
  std::__cxx11::string::string((string *)&local_e90,(string *)local_eb0);
  local_e90._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&v10,&v11);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v2);
  std::ifstream::~ifstream(&view6);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s3);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s1);
  std::ifstream::~ifstream(&fs3);
  std::ifstream::~ifstream(&fs2);
  std::ifstream::~ifstream(&fs1);
  std::__cxx11::string::~string((string *)&path);
  just::temp::directory::~directory(&tmp);
  return a_;
}

Assistant:

std::vector<std::string> split_lines(const char (&s_)[N])
  {
    using std::vector;
    using std::string;

    just::temp::directory tmp;
    const std::string path = tmp.path() + "/test";
    just::file::write(path, s_);

    std::ifstream fs1(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs2(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs3(path.c_str(), std::ios_base::binary | std::ios_base::in);

    std::istringstream s1(s_);
    std::istringstream s2(s_);
    std::istringstream s3(s_);

    const std::string str(s_);
    const just::lines::basic_view<string, KeepNewlines> view1(str);
    just::lines::basic_view<std::istream, KeepNewlines> view2(s1);
    just::lines::basic_view<std::istream, KeepNewlines> view3(fs1);

    just::lines::basic_view<std::istream, KeepNewlines> view4(s2);
    just::lines::basic_view<std::istream, KeepNewlines> view5(fs2);
    just::lines::basic_file_view<KeepNewlines> view6(path);

    converts_to<just::lines::basic_view<std::istream, KeepNewlines> >(view6);

    const vector<string> v1 = just::lines::split<KeepNewlines>(s_);
    const vector<string> v2 = just::lines::split<KeepNewlines>(&(s_[0]));
    const vector<string> v3 = just::lines::split<KeepNewlines>(string(s_));
    const vector<string> v4 = just::lines::split<KeepNewlines>(s3);
    const vector<string> v5 = just::lines::split<KeepNewlines>(fs3);
    const vector<string> v6 =
      just::lines::split_lines_of_file<KeepNewlines>(path);
    const vector<string> v7 = create_vector(view1);
    const vector<string> v8 = create_vector(view2);
    const vector<string> v9 = create_vector(view3);
    const vector<string> v10 = create_vector(view4);
    const vector<string> v11 = create_vector(view5);
    const vector<string> v12 = create_vector(view6);
    JUST_ASSERT_EQUAL_CONTAINER(v1, v2);
    JUST_ASSERT_EQUAL_CONTAINER(v2, v3);
    JUST_ASSERT_EQUAL_CONTAINER(v3, v4);
    JUST_ASSERT_EQUAL_CONTAINER(v4, v5);
    JUST_ASSERT_EQUAL_CONTAINER(v5, v6);
    JUST_ASSERT_EQUAL_CONTAINER(v6, v7);
    JUST_ASSERT_EQUAL_CONTAINER(v7, v8);
    JUST_ASSERT_EQUAL_CONTAINER(v8, v9);
    JUST_ASSERT_EQUAL_CONTAINER(v9, v10);
    JUST_ASSERT_EQUAL_CONTAINER(v10, v11);

    return v1;
  }